

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall
bloaty::RangeSink::ContainsVerboseFileOffset(RangeSink *this,uint64_t fileoff,uint64_t filesize)

{
  bool bVar1;
  int32 iVar2;
  uint64 uVar3;
  long in_RDX;
  ulong in_RSI;
  undefined1 local_29;
  undefined1 local_19;
  
  iVar2 = Options::verbose_level((Options *)0x188d06);
  local_19 = true;
  if (iVar2 < 2) {
    bVar1 = Options::has_debug_fileoff((Options *)0x188d21);
    local_29 = false;
    if (bVar1) {
      uVar3 = Options::debug_fileoff((Options *)0x188d3e);
      local_29 = false;
      if (in_RSI <= uVar3) {
        uVar3 = Options::debug_fileoff((Options *)0x188d5c);
        local_29 = uVar3 < in_RSI + in_RDX;
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool RangeSink::ContainsVerboseFileOffset(uint64_t fileoff, uint64_t filesize) {
  return options_.verbose_level() > 1 ||
         (options_.has_debug_fileoff() && options_.debug_fileoff() >= fileoff &&
          options_.debug_fileoff() < (fileoff + filesize));
}